

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_last.c
# Opt level: O2

int mpt_path_last(mpt_path *path)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  
  uVar2 = path->len;
  if ((uVar2 != 0) && (pcVar8 = path->base, pcVar8 != (char *)0x0)) {
    if (-1 < (char)path->flags) {
      uVar7 = 0;
      for (pcVar8 = pcVar8 + (uVar2 - 2);
          (uVar5 = uVar2 - 1, uVar2 - 1 != uVar7 && (uVar5 = uVar7, *pcVar8 != path->sep));
          pcVar8 = pcVar8 + -1) {
        uVar7 = uVar7 + 1;
      }
      iVar3 = (int)uVar5;
      path->off = ~uVar7 + uVar2 + path->off;
      path->first = (uint8_t)uVar5;
      sVar6 = (uVar5 & 0xff) + 1;
LAB_0010d9d5:
      path->len = sVar6;
      return iVar3;
    }
    if (uVar2 != 1) {
      bVar1 = pcVar8[uVar2 - 2];
      if ((ulong)(long)(char)bVar1 <= uVar2) {
        iVar3 = (int)(char)bVar1;
        path->off = path->off + (uVar2 - (long)(char)bVar1);
        path->first = bVar1;
        sVar6 = (ulong)bVar1 + 2;
        goto LAB_0010d9d5;
      }
    }
  }
  piVar4 = __errno_location();
  *piVar4 = 0x16;
  return -2;
}

Assistant:

extern int mpt_path_last(MPT_STRUCT(path) *path)
{
	const char *data;
	size_t len, pos;
	
	if (!(pos = path->len) || !(data = path->base)) {
		errno = EINVAL; return -2;
	}
	if (path->flags & MPT_PATHFLAG(SepBinary)) {
		if (pos < 2 || pos < (len = data[pos-2])) {
			errno = EINVAL; return -2;
		}
		pos -= len;
		
		path->off += pos;
		path->len  = (path->first = len) + 2;
		
		return len;
	}
	
	data += (--pos - 1);
	len = 0;
	
	/* find last separator */
	while (pos && *data != path->sep) {
		--data; ++len; --pos;
	}
	path->off += pos;
	path->len  = (path->first = len) + 1;
	
	return len;
}